

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O1

void ptrlist_split_node(ptr_list *head)

{
  allocator *A;
  ptr_list *ppVar1;
  ptr_list *ppVar2;
  char cVar3;
  size_t __n;
  int iVar4;
  int iVar5;
  
  A = head->allocator_;
  if (A != (allocator *)0x0) {
    iVar4 = (int)*(char *)head;
    ppVar2 = (ptr_list *)dmrC_allocator_allocate(A,0);
    ppVar1 = head->next_;
    ppVar2->allocator_ = A;
    iVar5 = iVar4 - iVar4 / 2;
    *(char *)head = (char)iVar5;
    ppVar2->next_ = ppVar1;
    ppVar1->prev_ = ppVar2;
    ppVar2->prev_ = head;
    head->next_ = ppVar2;
    cVar3 = (char)((uint)(iVar4 - (iVar4 >> 0x1f)) >> 1);
    *(char *)ppVar2 = cVar3;
    __n = (long)cVar3 << 3;
    memcpy(ppVar2->list_,head->list_ + iVar5,__n);
    memset(head->list_ + iVar5,0xf0,__n);
    return;
  }
  __assert_fail("alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/ptrlist.c"
                ,0x1d,"void ptrlist_split_node(struct ptr_list *)");
}

Assistant:

void ptrlist_split_node(struct ptr_list *head)
{
	int old = head->nr_, nr = old / 2;
	struct allocator *alloc = head->allocator_;
	assert(alloc);
	struct ptr_list *newlist =
	    (struct ptr_list *)dmrC_allocator_allocate(alloc, 0);
	struct ptr_list *next = head->next_;
	newlist->allocator_ = alloc;

	old -= nr;
	head->nr_ = old;
	newlist->next_ = next;
	next->prev_ = newlist;
	newlist->prev_ = head;
	head->next_ = newlist;
	newlist->nr_ = nr;
	memcpy(newlist->list_, head->list_ + old, nr * sizeof(void *));
	memset(head->list_ + old, 0xf0, nr * sizeof(void *));
}